

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O0

batch<float,_xsimd::sse4_2>
xsimd::kernel::acos<xsimd::sse4_2,float>
          (batch<float,_xsimd::sse4_2> *self,requires_arch<generic> param_2)

{
  float *self_00;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  float extraout_XMM0_Dd_07;
  float extraout_XMM0_Dd_08;
  float extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  float extraout_XMM0_Dd_11;
  float extraout_XMM0_Dd_12;
  batch<float,_xsimd::sse4_2> bVar3;
  batch_bool<float,_xsimd::sse4_2> bVar4;
  simd_register<float,_xsimd::sse4_2> sVar5;
  batch<float,_xsimd::sse4_2> local_148;
  batch<float,_xsimd::sse4_2> local_138;
  simd_register<float,_xsimd::sse3> local_128;
  batch<float,_xsimd::sse4_2> local_118;
  batch<float,_xsimd::sse4_2> local_108;
  batch_bool<float,_xsimd::sse4_2> local_f8;
  undefined1 local_e8 [16];
  simd_register<float,_xsimd::sse3> local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  batch<float,_xsimd::sse4_2> local_a8;
  batch<float,_xsimd::sse4_2> local_98;
  simd_register<float,_xsimd::sse3> local_88;
  simd_register<float,_xsimd::sse3> local_78;
  undefined1 local_68 [16];
  batch<float,_xsimd::sse4_2> local_58;
  undefined1 auStack_48 [8];
  batch_bool<float,_xsimd::sse4_2> x_larger_05;
  batch_type x;
  requires_arch<generic> param_2_local;
  batch<float,_xsimd::sse4_2> *self_local;
  
  bVar3 = abs<float,xsimd::sse4_2>(self);
  x.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)extraout_XMM0_Dc;
  x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       bVar3.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  x.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)extraout_XMM0_Dd;
  batch<float,_xsimd::sse4_2>::batch(&local_58,0.5);
  bVar4 = operator>((batch<float,_xsimd::sse4_2> *)
                    ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data + 8),&local_58);
  unique0x100000df = (float)extraout_XMM0_Dc_00;
  auStack_48._0_4_ =
       (float)(int)bVar4.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auStack_48._4_4_ =
       (float)(int)((ulong)bVar4.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  unique0x100000e3 = extraout_XMM0_Dd_00;
  batch<float,_xsimd::sse4_2>::batch(&local_98,-0.5);
  batch<float,_xsimd::sse4_2>::batch(&local_a8,0.5);
  bVar3 = fma<float,xsimd::sse4_2>
                    (&local_98,
                     (batch<float,_xsimd::sse4_2> *)
                     ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8),&local_a8);
  local_88.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_01;
  local_88.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_88.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_88.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_01;
  bVar3 = sqrt<float,xsimd::sse4_2>((batch<float,_xsimd::sse4_2> *)&local_88);
  local_78.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_02;
  local_78.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_78.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_78.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_02;
  bVar3 = select<float,xsimd::sse4_2>
                    ((batch_bool<float,_xsimd::sse4_2> *)auStack_48,
                     (batch<float,_xsimd::sse4_2> *)&local_78,self);
  x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       bVar3.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_68._8_4_ = extraout_XMM0_Dc_03;
  local_68._0_4_ =
       x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[2];
  local_68._4_4_ =
       x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[3];
  local_68._12_4_ = extraout_XMM0_Dd_03;
  bVar3 = asin<float,xsimd::sse4_2>
                    ((batch<float,_xsimd::sse4_2> *)
                     ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8));
  x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       bVar3.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_b8._8_4_ = extraout_XMM0_Dc_04;
  local_b8._0_4_ =
       x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[2];
  local_b8._4_4_ =
       x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[3];
  local_b8._12_4_ = extraout_XMM0_Dd_04;
  self_00 = (float *)((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8);
  bVar3 = xsimd::operator+((batch<float,_xsimd::sse4_2> *)self_00,
                           (batch<float,_xsimd::sse4_2> *)self_00);
  local_d8.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_05;
  local_d8.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_d8.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_d8.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_05;
  bVar3 = select<float,xsimd::sse4_2>
                    ((batch_bool<float,_xsimd::sse4_2> *)auStack_48,
                     (batch<float,_xsimd::sse4_2> *)&local_d8,
                     (batch<float,_xsimd::sse4_2> *)
                     ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8));
  x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data._8_8_ =
       bVar3.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_c8._8_4_ = extraout_XMM0_Dc_06;
  local_c8._0_4_ =
       x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[2];
  local_c8._4_4_ =
       x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
       super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
       super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[3];
  local_c8._12_4_ = extraout_XMM0_Dd_06;
  batch<float,_xsimd::sse4_2>::batch(&local_108,-0.5);
  bVar4 = xsimd::operator<(self,&local_108);
  local_f8.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[2] =
       (float)extraout_XMM0_Dc_07;
  local_f8.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar4.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_f8.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar4.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_f8.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[3] =
       extraout_XMM0_Dd_07;
  bVar3 = constants::pi<xsimd::batch<float,xsimd::sse4_2>>();
  local_128.super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_08;
  local_128.super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_128.super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_128.super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_08;
  bVar3 = xsimd::operator-((batch<float,_xsimd::sse4_2> *)&local_128,
                           (batch<float,_xsimd::sse4_2> *)
                           ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                                  super_simd_register<float,_xsimd::sse4_1>.
                                  super_simd_register<float,_xsimd::ssse3>.
                                  super_simd_register<float,_xsimd::sse3>.
                                  super_simd_register<float,_xsimd::sse2>.data + 8));
  local_118.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_09;
  local_118.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_118.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_118.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_09;
  bVar3 = select<float,xsimd::sse4_2>
                    (&local_f8,&local_118,
                     (batch<float,_xsimd::sse4_2> *)
                     ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                            super_simd_register<float,_xsimd::sse4_1>.
                            super_simd_register<float,_xsimd::ssse3>.
                            super_simd_register<float,_xsimd::sse3>.
                            super_simd_register<float,_xsimd::sse2>.data + 8));
  uVar2 = bVar3.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
          super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
          super_simd_register<float,_xsimd::sse2>.data._0_8_;
  auVar1._8_4_ = extraout_XMM0_Dc_10;
  auVar1._0_8_ = uVar2;
  auVar1._12_4_ = extraout_XMM0_Dd_10;
  local_e8._8_8_ = auVar1._8_8_;
  x.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)local_e8._8_4_;
  x.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)local_e8._12_4_;
  x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[2] =
       (float)(int)uVar2;
  x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
  super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[3] =
       (float)(int)((ulong)uVar2 >> 0x20);
  local_e8 = auVar1;
  bVar3 = constants::pio2<xsimd::batch<float,xsimd::sse4_2>>();
  local_148.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_11;
  local_148.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_148.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_148.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_11;
  bVar3 = xsimd::operator-(&local_148,
                           (batch<float,_xsimd::sse4_2> *)
                           ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                                  super_simd_register<float,_xsimd::sse4_1>.
                                  super_simd_register<float,_xsimd::ssse3>.
                                  super_simd_register<float,_xsimd::sse3>.
                                  super_simd_register<float,_xsimd::sse2>.data + 8));
  local_138.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)extraout_XMM0_Dc_12;
  local_138.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] =
       (float)(int)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                   super_simd_register<float,_xsimd::sse4_1>.
                   super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
                   super_simd_register<float,_xsimd::sse2>.data._0_8_;
  local_138.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] =
       (float)(int)((ulong)bVar3.super_simd_register<float,_xsimd::sse4_2>.
                           super_simd_register<float,_xsimd::sse4_1>.
                           super_simd_register<float,_xsimd::ssse3>.
                           super_simd_register<float,_xsimd::sse3>.
                           super_simd_register<float,_xsimd::sse2>.data._0_8_ >> 0x20);
  local_138.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = extraout_XMM0_Dd_12;
  sVar5.super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
  super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data =
       (simd_register<float,_xsimd::sse4_1>)
       select<float,xsimd::sse4_2>
                 ((batch_bool<float,_xsimd::sse4_2> *)auStack_48,
                  (batch<float,_xsimd::sse4_2> *)
                  ((long)x_larger_05.super_get_bool_simd_register_t<float,_xsimd::sse4_2>.
                         super_simd_register<float,_xsimd::sse4_1>.
                         super_simd_register<float,_xsimd::ssse3>.
                         super_simd_register<float,_xsimd::sse3>.
                         super_simd_register<float,_xsimd::sse2>.data + 8),&local_138);
  return (simd_register<float,_xsimd::sse4_2>)
         (simd_register<float,_xsimd::sse4_2>)
         sVar5.super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
         super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data;
}

Assistant:

inline batch<T, A> acos(batch<T, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<T, A>;
            batch_type x = abs(self);
            auto x_larger_05 = x > batch_type(0.5);
            x = select(x_larger_05, sqrt(fma(batch_type(-0.5), x, batch_type(0.5))), self);
            x = asin(x);
            x = select(x_larger_05, x + x, x);
            x = select(self < batch_type(-0.5), constants::pi<batch_type>() - x, x);
            return select(x_larger_05, x, constants::pio2<batch_type>() - x);
        }